

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

void __thiscall
r_exec::ObjectValue::valuate
          (ObjectValue *this,Code *destination,uint16_t write_index,uint16_t *extent_index)

{
  Code *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  Code *pCVar3;
  Atom local_2c [4];
  uint16_t *local_28;
  uint16_t *extent_index_local;
  Code *pCStack_18;
  uint16_t write_index_local;
  Code *destination_local;
  ObjectValue *this_local;
  
  local_28 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_18 = destination;
  destination_local = (Code *)this;
  (*(destination->super__Object)._vptr__Object[10])();
  r_code::Atom::RPointer((ushort)local_2c);
  iVar2 = (*(pCStack_18->super__Object)._vptr__Object[4])
                    (pCStack_18,(ulong)extent_index_local._6_2_);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_2c);
  r_code::Atom::~Atom(local_2c);
  pCVar1 = pCStack_18;
  pCVar3 = core::P::operator_cast_to_Code_((P *)&this->object);
  (*(pCVar1->super__Object)._vptr__Object[0x19])(pCVar1,pCVar3);
  return;
}

Assistant:

void ObjectValue::valuate(Code *destination, uint16_t write_index, uint16_t &extent_index) const
{
    destination->code(write_index) = Atom::RPointer(destination->references_size());
    destination->add_reference(object);
}